

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Fun_Caller<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>,std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&,0ul,1ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,undefined8 param_2,undefined8 *param_1,long *param_4,Type_Conversions_State *param_5)

{
  Result_Type pbVar1;
  Result_Type pbVar2;
  
  pbVar1 = boxed_cast<std::__cxx11::string_const&>((Boxed_Value *)*param_4,param_5);
  pbVar2 = boxed_cast<std::__cxx11::string_const&>((Boxed_Value *)(*param_4 + 0x10),param_5);
  (*(code *)*param_1)(__return_storage_ptr__,pbVar1,pbVar2);
  return __return_storage_ptr__;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }